

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable * pugi::impl::anon_unknown_0::new_xpath_variable(xpath_value_type type,char_t *name)

{
  undefined4 in_EDI;
  char_t *in_stack_fffffffffffffff8;
  xpath_variable_node_set *pxVar1;
  
  switch(in_EDI) {
  case 1:
    pxVar1 = new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_node_set>
                       (in_stack_fffffffffffffff8);
    break;
  case 2:
    pxVar1 = (xpath_variable_node_set *)
             new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_number>
                       (in_stack_fffffffffffffff8);
    break;
  case 3:
    pxVar1 = (xpath_variable_node_set *)
             new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_string>
                       (in_stack_fffffffffffffff8);
    break;
  case 4:
    pxVar1 = (xpath_variable_node_set *)
             new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_boolean>
                       (in_stack_fffffffffffffff8);
    break;
  default:
    pxVar1 = (xpath_variable_node_set *)0x0;
  }
  return &pxVar1->super_xpath_variable;
}

Assistant:

PUGI__FN xpath_variable* new_xpath_variable(xpath_value_type type, const char_t* name)
	{
		switch (type)
		{
		case xpath_type_node_set:
			return new_xpath_variable<xpath_variable_node_set>(name);

		case xpath_type_number:
			return new_xpath_variable<xpath_variable_number>(name);

		case xpath_type_string:
			return new_xpath_variable<xpath_variable_string>(name);

		case xpath_type_boolean:
			return new_xpath_variable<xpath_variable_boolean>(name);

		default:
			return 0;
		}
	}